

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void test34(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_data p_Var1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qpdf_data p_Var5;
  qpdf_data qpdf2;
  
  p_Var5 = (qpdf_data)qpdf_init();
  qpdf2 = p_Var5;
  iVar2 = qpdf_read(qpdf,infile,password);
  if (iVar2 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3fb,"void test34(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_read(p_Var5,xarg,"");
  if (iVar2 != 0) {
    __assert_fail("qpdf_read(qpdf2, xarg, \"\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3fc,"void test34(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_get_num_pages(qpdf);
  if (iVar2 != 0xb) {
    __assert_fail("qpdf_get_num_pages(qpdf) == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3fd,"void test34(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_get_num_pages(p_Var5);
  p_Var1 = qpdf;
  if (iVar2 != 1) {
    __assert_fail("qpdf_get_num_pages(qpdf2) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3fe,"void test34(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_page_n(qpdf,0);
  iVar2 = qpdf_oh_get_object_id(p_Var1,uVar3);
  p_Var1 = qpdf;
  if (iVar2 != 4) {
    __assert_fail("qpdf_oh_get_object_id(qpdf, qpdf_get_page_n(qpdf, 0)) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x403,"void test34(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_page_n(qpdf,10);
  iVar2 = qpdf_oh_get_object_id(p_Var1,uVar3);
  if (iVar2 != 0xe) {
    __assert_fail("qpdf_oh_get_object_id(qpdf, qpdf_get_page_n(qpdf, 10)) == 14",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x404,"void test34(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_page_n(qpdf,3);
  iVar2 = qpdf_find_page_by_oh(qpdf,uVar3);
  p_Var1 = qpdf;
  if (iVar2 != 3) {
    __assert_fail("qpdf_find_page_by_oh(qpdf, page3) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x406,"void test34(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_oh_get_object_id(qpdf,uVar3);
  iVar2 = qpdf_find_page_by_id(p_Var1,uVar4,0);
  if (iVar2 == 3) {
    uVar4 = qpdf_get_page_n(p_Var5,0);
    iVar2 = qpdf_add_page(qpdf,p_Var5,uVar4,0);
    if (iVar2 != 0) {
      __assert_fail("qpdf_add_page(qpdf, qpdf2, opage0, QPDF_FALSE) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x40b,"void test34(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_add_page_at(qpdf,p_Var5,uVar4,1,uVar3);
    if (iVar2 != 0) {
      __assert_fail("qpdf_add_page_at(qpdf, qpdf2, opage0, QPDF_TRUE, page3) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x40d,"void test34(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_remove_page(qpdf,uVar3);
    if (iVar2 != 0) {
      __assert_fail("qpdf_remove_page(qpdf, page3) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x40f,"void test34(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_add_page(qpdf,qpdf,uVar3,1);
    if (iVar2 == 0) {
      qpdf_init_write(qpdf,outfile);
      qpdf_set_static_ID(qpdf,1);
      qpdf_set_qdf_mode(qpdf,1);
      qpdf_set_suppress_original_object_IDs(qpdf,1);
      qpdf_write(qpdf);
      report_errors();
      qpdf_cleanup(&qpdf2);
      return;
    }
    __assert_fail("qpdf_add_page(qpdf, qpdf, page3, QPDF_TRUE) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x411,"void test34(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_find_page_by_id(qpdf, qpdf_oh_get_object_id(qpdf, page3), 0) == 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x407,"void test34(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test34(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test expects 11-pages.pdf as file1 and minimal.pdf as xarg. */

    /* Non-error cases for page API */

    qpdf_data qpdf2 = qpdf_init();
    assert(qpdf_read(qpdf, infile, password) == 0);
    assert(qpdf_read(qpdf2, xarg, "") == 0);
    assert(qpdf_get_num_pages(qpdf) == 11);
    assert(qpdf_get_num_pages(qpdf2) == 1);

    /* At this time, there is no C API for accessing stream data, so
     * we hard-code object IDs from a known input file.
     */
    assert(qpdf_oh_get_object_id(qpdf, qpdf_get_page_n(qpdf, 0)) == 4);
    assert(qpdf_oh_get_object_id(qpdf, qpdf_get_page_n(qpdf, 10)) == 14);
    qpdf_oh page3 = qpdf_get_page_n(qpdf, 3);
    assert(qpdf_find_page_by_oh(qpdf, page3) == 3);
    assert(qpdf_find_page_by_id(qpdf, qpdf_oh_get_object_id(qpdf, page3), 0) == 3);

    /* Add other page to the end */
    qpdf_oh opage0 = qpdf_get_page_n(qpdf2, 0);
    assert(qpdf_add_page(qpdf, qpdf2, opage0, QPDF_FALSE) == 0);
    /* Add other page before page 3 */
    assert(qpdf_add_page_at(qpdf, qpdf2, opage0, QPDF_TRUE, page3) == 0);
    /* Remove page 3 */
    assert(qpdf_remove_page(qpdf, page3) == 0);
    /* At page 3 back at the beginning */
    assert(qpdf_add_page(qpdf, qpdf, page3, QPDF_TRUE) == 0);

    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_qdf_mode(qpdf, QPDF_TRUE);
    qpdf_set_suppress_original_object_IDs(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
    qpdf_cleanup(&qpdf2);
}